

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall ON_DimStyle::SetTextMask(ON_DimStyle *this,ON_TextMask *mask)

{
  double border;
  MaskType source;
  MaskFrame source_00;
  anon_union_4_2_6147a14e_for_ON_Color_15 color;
  
  source = mask->m_mask_type;
  source_00 = mask->m_mask_frame;
  color = (mask->m_mask_color).field_0;
  border = mask->m_mask_border;
  SetDrawTextMask(this,(bool)(mask->m_bDrawMask & 1));
  SetMaskColor(this,(ON_Color)color);
  SetMaskFillType(this,source);
  SetMaskBorder(this,border);
  SetMaskFrameType(this,source_00);
  return;
}

Assistant:

void ON_DimStyle::SetTextMask(const ON_TextMask& mask)
{
  // In order for overrides to work correctly, each text mask property must be
  // set individually.
  const ON_TextMask local_mask(mask);
  SetDrawTextMask(local_mask.DrawTextMask());
  SetMaskColor(local_mask.MaskColor());
  SetMaskFillType(local_mask.MaskFillType());
  SetMaskBorder(local_mask.MaskBorder());
  SetMaskFrameType(local_mask.MaskFrameType());
}